

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Matcher<const_std::pair<phmap::priv::NonStandardLayout,_int>_&> *
testing::internal::
MatcherCastImpl<const_std::pair<phmap::priv::NonStandardLayout,_int>_&,_std::pair<const_phmap::priv::NonStandardLayout,_int>_>
::CastImpl(Matcher<const_std::pair<phmap::priv::NonStandardLayout,_int>_&> *__return_storage_ptr__,
          long value)

{
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  int local_28;
  
  local_50 = (undefined1  [8])&PTR__NonStandardLayout_00337320;
  local_48._M_p = (pointer)&local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,*(long *)(value + 8),*(long *)(value + 0x10) + *(long *)(value + 8)
            );
  local_28 = *(int *)(value + 0x28);
  Matcher<const_std::pair<phmap::priv::NonStandardLayout,_int>_&>::Matcher
            (__return_storage_ptr__,(pair<phmap::priv::NonStandardLayout,_int> *)local_50);
  local_50 = (undefined1  [8])&PTR__NonStandardLayout_00337320;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> CastImpl(const M& value,
                             std::false_type /* convertible_to_matcher */,
                             std::true_type /* convertible_to_T */) {
    return Matcher<T>(ImplicitCast_<T>(value));
  }